

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_wait_closed(LIBSSH2_CHANNEL *channel)

{
  LIBSSH2_SESSION *session_00;
  int iVar1;
  int rc;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel_local;
  
  session_00 = channel->session;
  if ((channel->remote).eof == '\0') {
    channel_local._4_4_ =
         _libssh2_error(session_00,-0x22,
                        "libssh2_channel_wait_closed() invoked when channel is not in EOF state");
  }
  else {
    if (channel->wait_closed_state == libssh2_NB_state_idle) {
      channel->wait_closed_state = libssh2_NB_state_created;
    }
    if ((channel->remote).close == '\0') {
      do {
        iVar1 = _libssh2_transport_read(session_00);
        if ((channel->remote).close != '\0') break;
      } while (0 < iVar1);
      if (iVar1 < 0) {
        return iVar1;
      }
    }
    channel->wait_closed_state = libssh2_NB_state_idle;
    channel_local._4_4_ = 0;
  }
  return channel_local._4_4_;
}

Assistant:

static int channel_wait_closed(LIBSSH2_CHANNEL *channel)
{
    LIBSSH2_SESSION *session = channel->session;
    int rc;

    if(!channel->remote.eof) {
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                              "libssh2_channel_wait_closed() invoked when "
                              "channel is not in EOF state");
    }

    if(channel->wait_closed_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Awaiting close of channel %lu/%lu", channel->local.id,
                       channel->remote.id));

        channel->wait_closed_state = libssh2_NB_state_created;
    }

    /*
     * While channel is not closed, read more packets from the network.
     * Either the channel will be closed or network timeout will occur.
     */
    if(!channel->remote.close) {
        do {
            rc = _libssh2_transport_read(session);
            if(channel->remote.close)
                /* it is now closed, move on! */
                break;
        } while(rc > 0);
        if(rc < 0)
            return rc;
    }

    channel->wait_closed_state = libssh2_NB_state_idle;

    return 0;
}